

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::NumberStringBuilder::getAllFieldPositions
          (NumberStringBuilder *this,FieldPositionIteratorHandler *fpih,UErrorCode *status)

{
  UBool UVar1;
  Field FVar2;
  Field local_2c;
  Field field;
  int32_t i;
  int32_t currentStart;
  Field current;
  UErrorCode *status_local;
  FieldPositionIteratorHandler *fpih_local;
  NumberStringBuilder *this_local;
  
  i = 0xb;
  field = ~UNUM_INTEGER_FIELD;
  local_2c = UNUM_INTEGER_FIELD;
  while( true ) {
    if (this->fLength <= (int)local_2c) {
      if (i != 0xb) {
        (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                  (fpih,(ulong)(uint)i,(ulong)field,(ulong)(uint)this->fLength);
      }
      return;
    }
    FVar2 = fieldAt(this,local_2c);
    if ((i == 0) && (FVar2 == UNUM_GROUPING_SEPARATOR_FIELD)) {
      (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                (fpih,6,(ulong)local_2c,(ulong)(local_2c + UNUM_FRACTION_FIELD));
    }
    else if (i != FVar2) {
      if (i != 0xb) {
        (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                  (fpih,(ulong)(uint)i,(ulong)field,(ulong)local_2c);
      }
      field = local_2c;
      i = FVar2;
    }
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') break;
    local_2c = local_2c + UNUM_FRACTION_FIELD;
  }
  return;
}

Assistant:

void NumberStringBuilder::getAllFieldPositions(FieldPositionIteratorHandler& fpih,
                                               UErrorCode& status) const {
    Field current = UNUM_FIELD_COUNT;
    int32_t currentStart = -1;
    for (int32_t i = 0; i < fLength; i++) {
        Field field = fieldAt(i);
        if (current == UNUM_INTEGER_FIELD && field == UNUM_GROUPING_SEPARATOR_FIELD) {
            // Special case: GROUPING_SEPARATOR counts as an INTEGER.
            fpih.addAttribute(UNUM_GROUPING_SEPARATOR_FIELD, i, i + 1);
        } else if (current != field) {
            if (current != UNUM_FIELD_COUNT) {
                fpih.addAttribute(current, currentStart, i);
            }
            current = field;
            currentStart = i;
        }
        if (U_FAILURE(status)) {
            return;
        }
    }
    if (current != UNUM_FIELD_COUNT) {
        fpih.addAttribute(current, currentStart, fLength);
    }
}